

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::Tree(Tree *this,Tree *that)

{
  Tree *in_stack_00000138;
  Tree *in_stack_00000140;
  
  Tree(this,(Callbacks *)that);
  _move(in_stack_00000140,in_stack_00000138);
  return;
}

Assistant:

Tree::Tree(Tree && that) noexcept : Tree(that.m_callbacks)
{
    _move(that);
}